

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O2

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
accept<asio::ip::tcp,asio::any_io_executor>
          (basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *this,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer,type param_2)

{
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  detail::reactive_socket_service<asio::ip::tcp>::
  accept<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>>
            (*(reactive_socket_service<asio::ip::tcp> **)this,(implementation_type *)(this + 8),peer
             ,(endpoint_type *)0x0,&local_28);
  detail::throw_error(&local_28,"accept");
  return;
}

Assistant:

void accept(basic_socket<Protocol1, Executor1>& peer,
      typename constraint<
        is_convertible<Protocol, Protocol1>::value
      >::type = 0)
  {
    asio::error_code ec;
    impl_.get_service().accept(impl_.get_implementation(),
        peer, static_cast<endpoint_type*>(0), ec);
    asio::detail::throw_error(ec, "accept");
  }